

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreCommands.cpp
# Opt level: O0

void __thiscall
HelpIRCCommand::trigger
          (HelpIRCCommand *this,IRC_Bot *source,string_view in_channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_type sVar5;
  size_type sVar6;
  char *pcVar7;
  Channel *pCVar8;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  size_t sVar9;
  char *pcVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  undefined1 auVar12 [16];
  size_t local_208;
  char *local_200;
  size_t local_1b8;
  char *local_1b0;
  size_t local_198;
  char *local_190;
  int command_access;
  IRCCommand *cmd;
  size_t local_148;
  char *local_140;
  undefined1 local_138 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char *local_110;
  string local_f8;
  __sv_type local_d8;
  size_t local_c8;
  char *pcStack_c0;
  undefined1 local_a8 [8];
  string triggers;
  vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> cmds;
  uint local_6c;
  int i;
  int access;
  Channel *channel;
  IRC_Bot *source_local;
  HelpIRCCommand *this_local;
  string_view nick_local;
  string_view in_channel_local;
  
  pcVar10 = nick._M_str;
  sVar9 = nick._M_len;
  lVar4 = Jupiter::IRC::Client::getChannel(source,in_channel._M_len,in_channel._M_str);
  if (lVar4 != 0) {
    iVar2 = Jupiter::IRC::Client::getAccessLevel(source,lVar4,sVar9,pcVar10);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
    if (bVar1) {
      for (local_6c = 0; (int)local_6c <= iVar2; local_6c = local_6c + 1) {
        IRC_Bot::getAccessCommands((Channel *)(triggers.field_2._M_local_buf + 8),(int)source);
        sVar5 = std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::size
                          ((vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *)
                           (triggers.field_2._M_local_buf + 8));
        if (sVar5 != 0) {
          IRC_Bot::getTriggers_abi_cxx11_((vector *)local_a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
          local_c8 = sVar9;
          pcStack_c0 = pcVar10;
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
          pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a8);
          string_printf_abi_cxx11_
                    (&local_f8,"Access level %d commands: %.*s",(ulong)local_6c,sVar6,pcVar7);
          local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f8);
          Jupiter::IRC::Client::sendNotice
                    (source,local_c8,pcStack_c0,local_d8._M_len,local_d8._M_str);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)local_a8);
        }
        std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::~vector
                  ((vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *)
                   (triggers.field_2._M_local_buf + 8));
      }
      join_0x00000010_0x00000000_ = sv("For command-specific help, use: help <command>",0x2e);
      Jupiter::IRC::Client::sendNotice(source,sVar9,pcVar10,command_split.second._M_str,local_110);
    }
    else {
      local_148 = parameters._M_len;
      local_140 = parameters._M_str;
      in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&cmd," \t");
      jessilib::
      word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_138,(jessilib *)&local_148,
                 (basic_string_view<char,_std::char_traits<char>_> *)&cmd,in_whitespace);
      pCVar8 = (Channel *)IRC_Bot::getCommand(source,local_138,command_split.first._M_len);
      if (pCVar8 == (Channel *)0x0) {
        bVar11 = sv("Error: Command not found.",0x19);
        local_208 = bVar11._M_len;
        local_200 = bVar11._M_str;
        Jupiter::IRC::Client::sendNotice(source,sVar9,pcVar10,local_208,local_200);
      }
      else {
        iVar3 = IRCCommand::getAccessLevel(pCVar8);
        if (iVar3 < 0) {
          bVar11 = sv("Error: Command disabled.",0x18);
          local_198 = bVar11._M_len;
          local_190 = bVar11._M_str;
          Jupiter::IRC::Client::sendNotice(source,sVar9,pcVar10,local_198,local_190);
        }
        else if (iVar2 < iVar3) {
          bVar11 = sv("Access Denied.",0xe);
          local_1b8 = bVar11._M_len;
          local_1b0 = bVar11._M_str;
          Jupiter::IRC::Client::sendNotice(source,sVar9,pcVar10,local_1b8,local_1b0);
        }
        else {
          auVar12 = (*(code *)**(undefined8 **)pCVar8)
                              (pCVar8,command_split.first._M_str,command_split.second._M_len);
          Jupiter::IRC::Client::sendNotice(source,sVar9,pcVar10,auVar12._0_8_,auVar12._8_8_);
        }
      }
    }
  }
  return;
}

Assistant:

void HelpIRCCommand::trigger(IRC_Bot *source, std::string_view in_channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *channel = source->getChannel(in_channel);
	if (channel != nullptr)
	{
		int access = source->getAccessLevel(*channel, nick);
		if (parameters.empty()) {
			for (int i = 0; i <= access; i++) {
				auto cmds = source->getAccessCommands(channel, i);
				if (cmds.size() != 0) {
					std::string triggers = source->getTriggers(cmds);
					if (triggers.size() >= 0) {
						source->sendNotice(nick, string_printf("Access level %d commands: %.*s", i, triggers.size(),
							triggers.data()));
					}
				}
			}
			source->sendNotice(nick, "For command-specific help, use: help <command>"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			IRCCommand *cmd = source->getCommand(command_split.first);
			if (cmd) {
				int command_access = cmd->getAccessLevel(channel);

				if (command_access < 0)
					source->sendNotice(nick, "Error: Command disabled."sv);
				else if (access < command_access)
					source->sendNotice(nick, "Access Denied."sv);
				else
					source->sendNotice(nick, cmd->getHelp(command_split.second));
			}
			else source->sendNotice(nick, "Error: Command not found."sv);
		}
	}
}